

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O2

JSONValue * __thiscall JSON::JSONValue::operator=(JSONValue *this,JSONValue *v)

{
  string *s;
  JSONObject *o;
  JSONArray *r;
  longlong *plVar1;
  bool *b;
  double d;
  
  switch(v->type) {
  case STRING:
    s = getStringValue_abi_cxx11_(v);
    setStringValue(this,s);
    break;
  case INTEGER:
    plVar1 = getIntValue(v);
    setIntValue(this,*plVar1);
    break;
  case DOUBLE:
    d = getDoubleValue(v);
    setDoubleValue(this,d);
    break;
  case ARRAY:
    r = getArrayValue(v);
    setArrayValue(this,r);
    break;
  case OBJECT:
    o = getObjectValue(v);
    setObjectValue(this,o);
    break;
  case BOOLEAN:
    b = getBoolValue(v);
    setBoolValue(this,b);
    break;
  case JSONNULL:
    setNull(this);
  }
  return this;
}

Assistant:

JSONValue &JSONValue::operator=(const JSONValue &v) {
	switch(v.getType()) {
		case STRING:
			setStringValue(v.getStringValue());
			break;
		case INTEGER:
			setIntValue(v.getIntValue());
			break;
		case DOUBLE:
			setDoubleValue(v.getDoubleValue());
			break;
		case ARRAY:
			setArrayValue(v.getArrayValue());
			break;
		case OBJECT:
			setObjectValue(v.getObjectValue());
			break;
		case BOOLEAN:
			setBoolValue(v.getBoolValue());
			break;
		case JSONNULL:
			setNull();
			break;
	}
	return *this;
}